

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_seek_to_start_of_stream(ma_dr_mp3 *pMP3)

{
  ma_bool32 mVar1;
  ma_dr_mp3 *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  mVar1 = ma_dr_mp3__on_seek(in_stack_ffffffffffffffe8,0,0x203e37);
  if (mVar1 != 0) {
    ma_dr_mp3_reset((ma_dr_mp3 *)0x203e50);
  }
  local_4 = (uint)(mVar1 != 0);
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_mp3_seek_to_start_of_stream(ma_dr_mp3* pMP3)
{
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(pMP3->onSeek != NULL);
    if (!ma_dr_mp3__on_seek(pMP3, 0, ma_dr_mp3_seek_origin_start)) {
        return MA_FALSE;
    }
    ma_dr_mp3_reset(pMP3);
    return MA_TRUE;
}